

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int compute_codewords(Codebook *c,uint8 *len,int n,uint32 *values)

{
  uint n_00;
  code *pcVar1;
  Codebook *c_00;
  int iVar2;
  uint huff_code;
  uint32 *in_RCX;
  int in_EDX;
  long in_RSI;
  Codebook *in_RDI;
  bool bVar3;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  int y;
  int z;
  uint32 res;
  SDL_AssertState sdl_assert_state;
  uint32 available [32];
  int m;
  int k;
  int i;
  bool local_d6;
  uint local_c8;
  uint local_c4;
  uint local_b8 [33];
  int local_34;
  int local_30;
  int local_2c;
  uint32 *local_28;
  int local_1c;
  long local_18;
  Codebook *local_10;
  
  local_34 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SDL_memset(local_b8,0,0x80);
  iVar2 = local_34;
  for (local_30 = 0; (local_30 < local_1c && (*(char *)(local_18 + local_30) == -1));
      local_30 = local_30 + 1) {
  }
  if (local_30 == local_1c) {
    do {
      if (local_10->sorted_entries == 0) {
        return 1;
      }
      iVar2 = SDL_ReportAssertion(&compute_codewords::sdl_assert_data,"compute_codewords",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                  ,0x43f);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      iVar2 = (*pcVar1)();
      return iVar2;
    }
  }
  else {
    local_34 = local_34 + 1;
    add_entry(local_10,0,local_30,iVar2,(uint)*(byte *)(local_18 + local_30),local_28);
    for (local_2c = 1; local_2c <= (int)(uint)*(byte *)(local_18 + local_30);
        local_2c = local_2c + 1) {
      local_b8[local_2c] = 1 << (0x20U - (char)local_2c & 0x1f);
    }
    for (local_2c = local_30 + 1; local_2c < local_1c; local_2c = local_2c + 1) {
      local_c4 = (uint)*(byte *)(local_18 + local_2c);
      if (local_c4 != 0xff) {
        while( true ) {
          bVar3 = false;
          if (0 < (int)local_c4) {
            bVar3 = local_b8[(int)local_c4] == 0;
          }
          if (!bVar3) break;
          local_c4 = local_c4 - 1;
        }
        if (local_c4 == 0) {
          return 0;
        }
        n_00 = local_b8[(int)local_c4];
        do {
          local_d6 = local_c4 < 0x20;
          if (local_d6) goto LAB_001444e3;
          iVar2 = SDL_ReportAssertion(&compute_codewords::sdl_assert_data_1,"compute_codewords",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                      ,0x456);
        } while (iVar2 == 0);
        if (iVar2 == 1) {
          pcVar1 = (code *)swi(3);
          iVar2 = (*pcVar1)();
          return iVar2;
        }
LAB_001444e3:
        local_b8[(int)local_c4] = 0;
        c_00 = local_10;
        huff_code = bit_reverse(n_00);
        iVar2 = local_34;
        local_34 = local_34 + 1;
        add_entry(c_00,huff_code,local_2c,iVar2,(uint)*(byte *)(local_18 + local_2c),local_28);
        if (local_c4 != *(byte *)(local_18 + local_2c)) {
          do {
            if (*(byte *)(local_18 + local_2c) < 0x20) goto LAB_001445f0;
            iVar2 = SDL_ReportAssertion(&compute_codewords::sdl_assert_data_2,"compute_codewords",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                        ,0x45b);
          } while (iVar2 == 0);
          if (iVar2 == 1) {
            pcVar1 = (code *)swi(3);
            iVar2 = (*pcVar1)();
            return iVar2;
          }
LAB_001445f0:
          for (local_c8 = (uint)*(byte *)(local_18 + local_2c); (int)local_c4 < (int)local_c8;
              local_c8 = local_c8 - 1) {
            do {
              if (local_b8[(int)local_c8] == 0) goto LAB_00144669;
              iVar2 = SDL_ReportAssertion(&compute_codewords::sdl_assert_data_3,"compute_codewords",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                          ,0x45d);
            } while (iVar2 == 0);
            if (iVar2 == 1) {
              pcVar1 = (code *)swi(3);
              iVar2 = (*pcVar1)();
              return iVar2;
            }
LAB_00144669:
            local_b8[(int)local_c8] = n_00 + (1 << (0x20U - (char)local_c8 & 0x1f));
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int compute_codewords(Codebook *c, uint8 *len, int n, uint32 *values)
{
   int i,k,m=0;
   uint32 available[32];

   memset(available, 0, sizeof(available));
   // find the first entry
   for (k=0; k < n; ++k) if (len[k] < NO_CODE) break;
   if (k == n) { assert(c->sorted_entries == 0); return TRUE; }
   // add to the list
   add_entry(c, 0, k, m++, len[k], values);
   // add all available leaves
   for (i=1; i <= len[k]; ++i)
      available[i] = 1U << (32-i);
   // note that the above code treats the first case specially,
   // but it's really the same as the following code, so they
   // could probably be combined (except the initial code is 0,
   // and I use 0 in available[] to mean 'empty')
   for (i=k+1; i < n; ++i) {
      uint32 res;
      int z = len[i], y;
      if (z == NO_CODE) continue;
      // find lowest available leaf (should always be earliest,
      // which is what the specification calls for)
      // note that this property, and the fact we can never have
      // more than one free leaf at a given level, isn't totally
      // trivial to prove, but it seems true and the assert never
      // fires, so!
      while (z > 0 && !available[z]) --z;
      if (z == 0) { return FALSE; }
      res = available[z];
      assert(z >= 0 && z < 32);
      available[z] = 0;
      add_entry(c, bit_reverse(res), i, m++, len[i], values);
      // propagate availability up the tree
      if (z != len[i]) {
         assert(len[i] >= 0 && len[i] < 32);
         for (y=len[i]; y > z; --y) {
            assert(available[y] == 0);
            available[y] = res + (1 << (32-y));
         }
      }
   }
   return TRUE;
}